

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

Gia_Obj_t * Gia_ManAppendObj(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  uint v;
  long lVar4;
  
  v = p->nObjs;
  if (v == p->nObjsAlloc) {
    uVar1 = v * 2;
    if (0x1fffffff < (int)(v * 2)) {
      uVar1 = 0x20000000;
    }
    if (v == 0x20000000) {
      puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
      exit(1);
    }
    if ((int)uVar1 <= (int)v) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x25f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)v,(ulong)uVar1);
      v = p->nObjsAlloc;
    }
    if ((int)v < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x262,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    lVar4 = (long)(int)uVar1;
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      pGVar2 = (Gia_Obj_t *)malloc(lVar4 * 0xc);
    }
    else {
      pGVar2 = (Gia_Obj_t *)realloc(p->pObjs,lVar4 * 0xc);
      v = p->nObjsAlloc;
    }
    p->pObjs = pGVar2;
    memset(pGVar2 + (int)v,0,(long)(int)(uVar1 - v) * 0xc);
    if (p->pMuxes != (uint *)0x0) {
      puVar3 = (uint *)realloc(p->pMuxes,lVar4 * 4);
      p->pMuxes = puVar3;
      memset(puVar3 + p->nObjsAlloc,0,(lVar4 - p->nObjsAlloc) * 4);
    }
    p->nObjsAlloc = uVar1;
    v = p->nObjs;
  }
  p->nObjs = v + 1;
  pGVar2 = Gia_ManObj(p,v);
  return pGVar2;
}

Assistant:

static inline Gia_Obj_t * Gia_ManAppendObj( Gia_Man_t * p )  
{ 
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, (1 << 29) );
        if ( p->nObjs == (1 << 29) )
            printf( "Hard limit on the number of nodes (2^29) is reached. Quitting...\n" ), exit(1);
        assert( p->nObjs < nObjNew );
        if ( p->fVerbose )
            printf("Extending GIA object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
        assert( p->nObjsAlloc > 0 );
        p->pObjs = ABC_REALLOC( Gia_Obj_t, p->pObjs, nObjNew );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gia_Obj_t) * (nObjNew - p->nObjsAlloc) );
        if ( p->pMuxes )
        {
            p->pMuxes = ABC_REALLOC( unsigned, p->pMuxes, nObjNew );
            memset( p->pMuxes + p->nObjsAlloc, 0, sizeof(unsigned) * (nObjNew - p->nObjsAlloc) );
        }
        p->nObjsAlloc = nObjNew;
    }
    return Gia_ManObj( p, p->nObjs++ );
}